

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Track::~Track(Track *this)

{
  ContentEncoding *this_00;
  ContentEncoding *encoding;
  uint32_t i;
  Track *this_local;
  
  this->_vptr_Track = (_func_int **)&PTR__Track_00180988;
  if (this->codec_id_ != (char *)0x0) {
    operator_delete__(this->codec_id_);
  }
  if (this->codec_private_ != (uint8_t *)0x0) {
    operator_delete__(this->codec_private_);
  }
  if (this->language_ != (char *)0x0) {
    operator_delete__(this->language_);
  }
  if (this->name_ != (char *)0x0) {
    operator_delete__(this->name_);
  }
  if (this->content_encoding_entries_ != (ContentEncoding **)0x0) {
    for (encoding._4_4_ = 0; encoding._4_4_ < this->content_encoding_entries_size_;
        encoding._4_4_ = encoding._4_4_ + 1) {
      this_00 = this->content_encoding_entries_[encoding._4_4_];
      if (this_00 != (ContentEncoding *)0x0) {
        ContentEncoding::~ContentEncoding(this_00);
        operator_delete(this_00);
      }
    }
    if (this->content_encoding_entries_ != (ContentEncoding **)0x0) {
      operator_delete__(this->content_encoding_entries_);
    }
  }
  return;
}

Assistant:

Track::~Track() {
  delete[] codec_id_;
  delete[] codec_private_;
  delete[] language_;
  delete[] name_;

  if (content_encoding_entries_) {
    for (uint32_t i = 0; i < content_encoding_entries_size_; ++i) {
      ContentEncoding* const encoding = content_encoding_entries_[i];
      delete encoding;
    }
    delete[] content_encoding_entries_;
  }
}